

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::CBString::CBString(CBString *this,char *s)

{
  CBStringException *pCVar1;
  uchar *puVar2;
  allocator local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  CBStringException bstr__cppwrapper_exception_1;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  CBStringException bstr__cppwrapper_exception;
  size_t sslen;
  char *s_local;
  CBString *this_local;
  
  this->_vptr_CBString = (_func_int **)&PTR__CBString_0026f840;
  if (s != (char *)0x0) {
    bstr__cppwrapper_exception.msg.field_2._8_8_ = strlen(s);
    if (0x7ffffffe < (ulong)bstr__cppwrapper_exception.msg.field_2._8_8_) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_68,"CBString::Failure in (char *) constructor, string too large",
                 &local_69);
      CBStringException::CBStringException((CBStringException *)local_48,&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      pCVar1 = (CBStringException *)__cxa_allocate_exception(0x28);
      CBStringException::CBStringException(pCVar1,(CBStringException *)local_48);
      __cxa_throw(pCVar1,&CBStringException::typeinfo,CBStringException::~CBStringException);
    }
    (this->super_tagbstring).slen = (int)bstr__cppwrapper_exception.msg.field_2._8_8_;
    (this->super_tagbstring).mlen = (this->super_tagbstring).slen + 1;
    puVar2 = (uchar *)malloc((long)(this->super_tagbstring).mlen);
    (this->super_tagbstring).data = puVar2;
    if (puVar2 != (uchar *)0x0) {
      memcpy((this->super_tagbstring).data,s,(long)(this->super_tagbstring).mlen);
      return;
    }
  }
  (this->super_tagbstring).data = (uchar *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c8,"CBString::Failure in (char *) constructor",&local_c9);
  CBStringException::CBStringException((CBStringException *)local_a8,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  pCVar1 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar1,(CBStringException *)local_a8);
  __cxa_throw(pCVar1,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

CBString::CBString (const char *s) {
	if (s) {
		size_t sslen = strlen (s);
		if (sslen >= INT_MAX) bstringThrow ("Failure in (char *) constructor, string too large")
		slen = (int) sslen;
		mlen = slen + 1;
		if (NULL != (data = (unsigned char *) bstr__alloc (mlen))) {
			bstr__memcpy (data, s, mlen);
			return;
		}
	}
	data = NULL;
	bstringThrow ("Failure in (char *) constructor");
}